

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitstream.cpp
# Opt level: O0

ConstantValue *
slang::ast::Bitstream::reOrder
          (ConstantValue *__return_storage_ptr__,ConstantValue *value,size_t sliceSize,
          size_t unpackWidth)

{
  ConstantValue *__args;
  size_type sVar1;
  bool bVar2;
  size_t sVar3;
  reference ppCVar4;
  size_t sVar5;
  unsigned_long *puVar6;
  const_iterator ppCVar7;
  size_t local_148;
  ulong local_130;
  size_t i;
  const_iterator iter;
  size_t nextIndex;
  bitwidth_t local_104;
  PackIterator ppCStack_100;
  bitwidth_t bit;
  const_iterator iter_1;
  size_t slice;
  size_type sStack_e8;
  bitwidth_t width;
  size_t index;
  anon_class_24_3_4aefb7ac sliceOrAppend;
  undefined1 local_c0 [8];
  vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> result;
  size_t trimWidth;
  size_t extraBits;
  size_type sStack_90;
  bitwidth_t rightWidth;
  size_t rightIndex;
  undefined1 local_78 [8];
  SmallVector<slang::ConstantValue_*,_5UL> packed;
  size_t numBlocks;
  size_t totalWidth;
  size_t unpackWidth_local;
  size_t sliceSize_local;
  ConstantValue *value_local;
  
  sVar3 = slang::ConstantValue::bitstreamWidth(value);
  if (unpackWidth <= sVar3) {
    local_148 = sVar3;
    if (unpackWidth != 0) {
      local_148 = unpackWidth;
    }
    packed.stackBase._24_8_ = ((local_148 + sliceSize) - 1) / sliceSize;
    if ((ulong)packed.stackBase._24_8_ < 2) {
      slang::ConstantValue::ConstantValue(__return_storage_ptr__,value);
    }
    else {
      SmallVector<slang::ConstantValue_*,_5UL>::SmallVector
                ((SmallVector<slang::ConstantValue_*,_5UL> *)local_78);
      packBitstream(value,(SmallVectorBase<slang::ConstantValue_*> *)local_78);
      bVar2 = SmallVectorBase<slang::ConstantValue_*>::empty
                        ((SmallVectorBase<slang::ConstantValue_*> *)local_78);
      if (bVar2) {
        slang::ConstantValue::ConstantValue(__return_storage_ptr__,value);
        rightIndex._0_4_ = 1;
      }
      else {
        sStack_90 = SmallVectorBase<slang::ConstantValue_*>::size
                              ((SmallVectorBase<slang::ConstantValue_*> *)local_78);
        sStack_90 = sStack_90 - 1;
        ppCVar4 = SmallVectorBase<slang::ConstantValue_*>::back
                            ((SmallVectorBase<slang::ConstantValue_*> *)local_78);
        sVar5 = slang::ConstantValue::bitstreamWidth(*ppCVar4);
        extraBits._4_4_ = (uint)sVar5;
        trimWidth = 0;
        if (unpackWidth != 0) {
          if (unpackWidth < sVar3) {
            result.super__Vector_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(sVar3 - unpackWidth);
            while ((pointer)(ulong)extraBits._4_4_ <=
                   result.
                   super__Vector_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage) {
              sStack_90 = sStack_90 - 1;
              result.super__Vector_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage =
                   (pointer)((long)result.
                                   super__Vector_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (ulong)extraBits._4_4_);
              ppCVar4 = SmallVectorBase<slang::ConstantValue_*>::operator[]
                                  ((SmallVectorBase<slang::ConstantValue_*> *)local_78,sStack_90);
              sVar3 = slang::ConstantValue::bitstreamWidth(*ppCVar4);
              extraBits._4_4_ = (uint)sVar3;
            }
            extraBits._4_4_ =
                 extraBits._4_4_ -
                 (int)result.
                      super__Vector_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
          }
          trimWidth = unpackWidth % sliceSize;
        }
        std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::vector
                  ((vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)local_c0);
        sliceOrAppend.packed =
             (SmallVector<slang::ConstantValue_*,_5UL> *)
             SmallVectorBase<slang::ConstantValue_*>::size
                       ((SmallVectorBase<slang::ConstantValue_*> *)local_78);
        puVar6 = std::max<unsigned_long>
                           ((unsigned_long *)&sliceOrAppend.packed,
                            (unsigned_long *)(packed.stackBase + 0x18));
        std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::reserve
                  ((vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)local_c0,
                   *puVar6);
        index = (long)&extraBits + 4;
        sliceOrAppend.rightWidth = (bitwidth_t *)local_c0;
        sliceOrAppend.result =
             (vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)local_78;
        for (; 1 < (ulong)packed.stackBase._24_8_;
            packed.stackBase._24_8_ = packed.stackBase._24_8_ + -1) {
          sStack_e8 = sStack_90;
          slice._4_4_ = extraBits._4_4_;
          iter_1 = (const_iterator)sliceSize;
          if (trimWidth != 0) {
            iter_1 = (const_iterator)trimWidth;
            trimWidth = 0;
          }
          while ((const_iterator)(ulong)slice._4_4_ <= iter_1) {
            sStack_e8 = sStack_e8 - 1;
            iter_1 = (const_iterator)((long)iter_1 - (ulong)slice._4_4_);
            ppCVar4 = SmallVectorBase<slang::ConstantValue_*>::operator[]
                                ((SmallVectorBase<slang::ConstantValue_*> *)local_78,sStack_e8);
            sVar3 = slang::ConstantValue::bitstreamWidth(*ppCVar4);
            slice._4_4_ = (uint)sVar3;
          }
          ppCVar7 = std::cbegin<slang::SmallVector<slang::ConstantValue*,5ul>>
                              ((SmallVector<slang::ConstantValue_*,_5UL> *)local_78);
          ppCStack_100 = ppCVar7 + sStack_e8;
          if (iter_1 != (const_iterator)0x0) {
            local_104 = slice._4_4_ - (bitwidth_t)iter_1;
            ppCVar7 = std::cend<slang::SmallVector<slang::ConstantValue*,5ul>>
                                ((SmallVector<slang::ConstantValue_*,_5UL> *)local_78);
            slicePacked((ast *)&nextIndex,&stack0xffffffffffffff00,ppCVar7,&local_104,
                        (bitwidth_t)iter_1);
            std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::
            emplace_back<slang::SVInt>
                      ((vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)
                       local_c0,(SVInt *)&nextIndex);
            SVInt::~SVInt((SVInt *)&nextIndex);
            slice._4_4_ = slice._4_4_ - (int)iter_1;
          }
          sVar1 = sStack_e8;
          ppCStack_100 = ppCStack_100 + 1;
          while (sStack_e8 = sStack_e8 + 1, sStack_e8 < sStack_90) {
            __args = *ppCStack_100;
            ppCStack_100 = ppCStack_100 + 1;
            std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::
            emplace_back<slang::ConstantValue>
                      ((vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)
                       local_c0,__args);
          }
          if (sStack_e8 == sStack_90) {
            reOrder::anon_class_24_3_4aefb7ac::operator()
                      ((anon_class_24_3_4aefb7ac *)&index,ppCStack_100);
          }
          sStack_90 = sVar1;
          extraBits._4_4_ = slice._4_4_;
        }
        i = (size_t)std::cbegin<slang::SmallVector<slang::ConstantValue*,5ul>>
                              ((SmallVector<slang::ConstantValue_*,_5UL> *)local_78);
        for (local_130 = 0; local_130 < sStack_90; local_130 = local_130 + 1) {
          std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::
          emplace_back<slang::ConstantValue>
                    ((vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)local_c0
                     ,*(ConstantValue **)i);
          i = i + 8;
        }
        reOrder::anon_class_24_3_4aefb7ac::operator()
                  ((anon_class_24_3_4aefb7ac *)&index,(PackIterator)i);
        slang::ConstantValue::ConstantValue(__return_storage_ptr__,(Elements *)local_c0);
        rightIndex._0_4_ = 1;
        std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::~vector
                  ((vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)local_c0);
      }
      SmallVector<slang::ConstantValue_*,_5UL>::~SmallVector
                ((SmallVector<slang::ConstantValue_*,_5UL> *)local_78);
    }
    return __return_storage_ptr__;
  }
  assert::assertFailed
            ("unpackWidth <= totalWidth",
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/Bitstream.cpp"
             ,0x22d,
             "static ConstantValue slang::ast::Bitstream::reOrder(ConstantValue &&, size_t, size_t)"
            );
}

Assistant:

ConstantValue Bitstream::reOrder(ConstantValue&& value, size_t sliceSize, size_t unpackWidth) {
    size_t totalWidth = value.bitstreamWidth();
    ASSERT(unpackWidth <= totalWidth);

    size_t numBlocks = ((unpackWidth ? unpackWidth : totalWidth) + sliceSize - 1) / sliceSize;
    if (numBlocks <= 1)
        return std::move(value);

    SmallVector<ConstantValue*> packed;
    packBitstream(value, packed);
    if (packed.empty())
        return std::move(value);

    size_t rightIndex = packed.size() - 1; // Right-to-left
    bitwidth_t rightWidth = static_cast<bitwidth_t>(packed.back()->bitstreamWidth());
    size_t extraBits = 0;

    if (unpackWidth) {
        if (unpackWidth < totalWidth) { // left-aligned so trim rightmost
            auto trimWidth = totalWidth - unpackWidth;
            while (trimWidth >= rightWidth) {
                rightIndex--;
                trimWidth -= rightWidth;
                rightWidth = static_cast<bitwidth_t>(packed[rightIndex]->bitstreamWidth());
            }
            rightWidth -= static_cast<bitwidth_t>(trimWidth);
        }

        // For unpack, extraBits is for the first block.
        // For pack, extraBits is for the last block.
        extraBits = unpackWidth % sliceSize;
    }

    std::vector<ConstantValue> result;
    result.reserve(std::max(packed.size(), numBlocks));
    auto sliceOrAppend = [&](PackIterator iter) {
        if (rightWidth == (*iter)->bitstreamWidth())
            result.emplace_back(std::move(**iter));
        else {
            bitwidth_t bit = 0;
            result.emplace_back(slicePacked(iter, std::cend(packed), bit, rightWidth));
        }
    };

    while (numBlocks > 1) {
        size_t index = rightIndex;
        bitwidth_t width = rightWidth;
        size_t slice = sliceSize;
        if (extraBits) {
            slice = extraBits;
            extraBits = 0;
        }
        while (slice >= width) {
            index--;
            slice -= width;
            width = static_cast<bitwidth_t>(packed[index]->bitstreamWidth());
        }

        // A block composed of bits from the last "slice" bits of packed[index] to the first
        // "rightWidth" bits of packed[rightIndex].
        auto iter = std::cbegin(packed) + index;
        if (slice) {
            auto bit = static_cast<bitwidth_t>(width - slice);
            result.emplace_back(
                slicePacked(iter, std::cend(packed), bit, static_cast<bitwidth_t>(slice)));
            width -= static_cast<bitwidth_t>(slice);
        }

        iter++;
        auto nextIndex = index;
        while (++index < rightIndex)
            result.emplace_back(std::move(**iter++));

        if (index == rightIndex)
            sliceOrAppend(iter);

        rightIndex = nextIndex;
        rightWidth = width;
        numBlocks--;
    }

    // For pack, the last block may be smaller than slice size.
    auto iter = std::cbegin(packed);
    for (size_t i = 0; i < rightIndex; i++)
        result.emplace_back(std::move(**iter++));
    sliceOrAppend(iter);

    return result;
}